

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlSetUniformSampler(int locIndex,uint textureId)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  uint textureId_local;
  int locIndex_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (RLGL.State.activeTextureId[local_14] == textureId) {
      return;
    }
  }
  local_18 = 0;
  while( true ) {
    if (3 < local_18) {
      return;
    }
    if (RLGL.State.activeTextureId[local_18] == 0) break;
    local_18 = local_18 + 1;
  }
  (*glad_glUniform1i)(locIndex,local_18 + 1);
  RLGL.State.activeTextureId[local_18] = textureId;
  return;
}

Assistant:

void rlSetUniformSampler(int locIndex, unsigned int textureId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Check if texture is already active
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) if (RLGL.State.activeTextureId[i] == textureId) return;

    // Register a new active texture for the internal batch system
    // NOTE: Default texture is always activated as GL_TEXTURE0
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
    {
        if (RLGL.State.activeTextureId[i] == 0)
        {
            glUniform1i(locIndex, 1 + i);              // Activate new texture unit
            RLGL.State.activeTextureId[i] = textureId; // Save texture id for binding on drawing
            break;
        }
    }
#endif
}